

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::Utils::Program::BuildException::~BuildException(BuildException *this)

{
  BuildException *this_local;
  
  ~BuildException(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

virtual ~BuildException() throw()
		{
		}